

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_2f8d3d7::SignatureExtractorChecker::CheckECDSASignature
          (SignatureExtractorChecker *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *scriptSig,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchPubKey,CScript *scriptCode,
          SigVersion sigversion)

{
  SignatureData *pSVar1;
  int iVar2;
  long in_FS_OFFSET;
  CPubKey pubkey;
  CKeyID local_f0 [3];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
  local_8d [20];
  CPubKey local_79;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (**((this->super_DeferringSignatureChecker).m_checker)->_vptr_BaseSignatureChecker)();
  if (SUB41(iVar2,0) != false) {
    CPubKey::Set<unsigned_char_const*>
              (&local_79,
               (vchPubKey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_start,
               (vchPubKey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_finish);
    pSVar1 = this->sigdata;
    CPubKey::GetID((CKeyID *)local_8d,&local_79);
    memcpy(local_f0,&local_79,0x41);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_a8,scriptSig);
    std::
    _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
    ::
    _M_emplace_unique<CKeyID,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_bool>
                *)&pSVar1->signatures,local_8d,local_f0,
               (pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               scriptCode);
    if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return SUB41(iVar2,0);
  }
  __stack_chk_fail();
}

Assistant:

bool CheckECDSASignature(const std::vector<unsigned char>& scriptSig, const std::vector<unsigned char>& vchPubKey, const CScript& scriptCode, SigVersion sigversion) const override
    {
        if (m_checker.CheckECDSASignature(scriptSig, vchPubKey, scriptCode, sigversion)) {
            CPubKey pubkey(vchPubKey);
            sigdata.signatures.emplace(pubkey.GetID(), SigPair(pubkey, scriptSig));
            return true;
        }
        return false;
    }